

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_10f5107::HandleLockCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  undefined7 extraout_var;
  string *in_base;
  Status SVar6;
  FILE *__stream;
  cmGlobalGenerator *pcVar7;
  cmFileLockPool *this;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  string_view value;
  string parentDir;
  cmFileLockResult local_c8;
  uint local_bc;
  pointer local_b8;
  string result;
  string path;
  string resultVariable;
  string local_50;
  
  resultVariable._M_dataplus._M_p = (pointer)&resultVariable.field_2;
  resultVariable._M_string_length = 0;
  resultVariable.field_2._M_local_buf[0] = '\0';
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    pcVar2 = status->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"sub-command LOCK requires at least two arguments.",
               (allocator<char> *)&parentDir);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&path);
    std::__cxx11::string::~string((string *)&path);
    bVar5 = false;
    goto LAB_0039e20b;
  }
  std::__cxx11::string::string((string *)&path,(string *)(pbVar1 + 1));
  local_b8 = (pointer)0xffffffffffffffff;
  iVar10 = 2;
  local_bc = 0;
  uVar9 = 2;
  bVar5 = false;
  while( true ) {
    uVar8 = (uint)uVar9;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar9)
    break;
    bVar4 = std::operator==(pbVar1 + uVar9,"DIRECTORY");
    if (bVar4) {
      bVar5 = true;
      pcVar3 = local_b8;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9,"RELEASE");
      if (!bVar4) {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar9,"GUARD");
        if (bVar4) {
          uVar8 = uVar8 + 1;
          uVar9 = (ulong)uVar8;
          result._M_dataplus._M_p = "expected FUNCTION, FILE or PROCESS after GUARD";
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if (uVar9 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)
             ) {
            bVar4 = std::operator==(pbVar1 + uVar9,"FUNCTION");
            iVar10 = 0;
            pcVar3 = local_b8;
            if (!bVar4) {
              bVar4 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9,"FILE");
              iVar10 = 1;
              pcVar3 = local_b8;
              if (!bVar4) {
                bVar4 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar9,"PROCESS"
                                       );
                iVar10 = 2;
                pcVar3 = local_b8;
                if (!bVar4) {
                  pcVar2 = status->Makefile;
                  cmStrCat<char_const*&,char_const(&)[15],std::__cxx11::string_const&,char_const(&)[3]>
                            (&parentDir,(char **)&result,(char (*) [15])", but got:\n  \"",
                             (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar9,
                             (char (*) [3])0x795130);
                  cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
                  goto LAB_0039e1f5;
                }
              }
            }
            goto LAB_0039dcfd;
          }
          pcVar2 = status->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&parentDir,"expected FUNCTION, FILE or PROCESS after GUARD",
                     (allocator<char> *)&local_50);
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
        }
        else {
          bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                  "RESULT_VARIABLE");
          if (bVar4) {
            uVar8 = uVar8 + 1;
            if ((ulong)uVar8 <
                (ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5)) {
              std::__cxx11::string::_M_assign((string *)&resultVariable);
              pcVar3 = local_b8;
              goto LAB_0039dcfd;
            }
            pcVar2 = status->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&parentDir,"expected variable name after RESULT_VARIABLE",
                       (allocator<char> *)&result);
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
          }
          else {
            bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9,"TIMEOUT");
            if (bVar4) {
              uVar8 = uVar8 + 1;
              uVar9 = (ulong)uVar8;
              pbVar1 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if (uVar9 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1
                                 >> 5)) {
                bVar4 = cmStrToLong(pbVar1 + uVar9,(long *)&result);
                pcVar3 = result._M_dataplus._M_p;
                if (bVar4 && -1 < (long)result._M_dataplus._M_p) goto LAB_0039dcfd;
                pcVar2 = status->Makefile;
                cmStrCat<char_const(&)[16],std::__cxx11::string_const&,char_const(&)[30]>
                          (&parentDir,(char (*) [16])"TIMEOUT value \"",
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar9,
                           (char (*) [30])"\" is not an unsigned integer.");
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
              }
              else {
                pcVar2 = status->Makefile;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&parentDir,"expected timeout value after TIMEOUT",
                           (allocator<char> *)&result);
                cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
              }
            }
            else {
              pcVar2 = status->Makefile;
              cmStrCat<char_const(&)[56],char_const(&)[19],std::__cxx11::string_const&,char_const(&)[3]>
                        (&parentDir,
                         (char (*) [56])"expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                         (char (*) [19])"TIMEOUT\nbut got: \"",
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar9,(char (*) [3])0x795130);
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&parentDir);
            }
          }
        }
LAB_0039e1f5:
        std::__cxx11::string::~string((string *)&parentDir);
        bVar5 = false;
        goto LAB_0039e201;
      }
      local_bc = (uint)CONCAT71(extraout_var,1);
      pcVar3 = local_b8;
    }
LAB_0039dcfd:
    local_b8 = pcVar3;
    uVar9 = (ulong)(uVar8 + 1);
  }
  if (bVar5) {
    std::__cxx11::string::append((char *)&path);
  }
  in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&parentDir,&path,in_base);
  std::__cxx11::string::operator=((string *)&path,(string *)&parentDir);
  std::__cxx11::string::~string((string *)&parentDir);
  cmsys::SystemTools::GetParentDirectory(&parentDir,&path);
  SVar6 = cmsys::SystemTools::MakeDirectory(&parentDir,(mode_t *)0x0);
  if (SVar6.Kind_ == Success) {
    __stream = (FILE *)cmsys::SystemTools::Fopen(&path,"w");
    if (__stream == (FILE *)0x0) {
      pcVar2 = status->Makefile;
      cmStrCat<char_const(&)[9],std::__cxx11::string&,char_const(&)[39]>
                (&result,(char (*) [9])0x7b6007,&path,
                 (char (*) [39])"\"\ncreation failed (check permissions).");
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&result);
      goto LAB_0039dee7;
    }
    fclose(__stream);
    pcVar7 = cmMakefile::GetGlobalGenerator(status->Makefile);
    cmFileLockResult::MakeOk();
    this = &pcVar7->FileLockPool;
    if ((local_bc & 1) == 0) {
      if (iVar10 == 2) {
        local_c8 = cmFileLockPool::LockProcessScope(this,&path,(unsigned_long)local_b8);
      }
      else if (iVar10 == 1) {
        local_c8 = cmFileLockPool::LockFileScope(this,&path,(unsigned_long)local_b8);
      }
      else {
        local_c8 = cmFileLockPool::LockFunctionScope(this,&path,(unsigned_long)local_b8);
      }
    }
    else {
      local_c8 = cmFileLockPool::Release(this,&path);
    }
    cmFileLockResult::GetOutputMessage_abi_cxx11_(&result,&local_c8);
    if (resultVariable._M_string_length == 0) {
      bVar5 = cmFileLockResult::IsOk(&local_c8);
      if (bVar5) {
        if (resultVariable._M_string_length != 0) goto LAB_0039e10e;
        bVar5 = true;
      }
      else {
        pcVar2 = status->Makefile;
        cmStrCat<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[2]>
                  (&local_50,(char (*) [23])"error locking file\n  \"",&path,(char (*) [3])0x7d35e5,
                   &result,(char (*) [2])0x793a2d);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmSystemTools::s_FatalErrorOccurred = true;
        bVar5 = false;
      }
    }
    else {
LAB_0039e10e:
      bVar5 = true;
      value._M_str = result._M_dataplus._M_p;
      value._M_len = result._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&resultVariable,value);
    }
    std::__cxx11::string::~string((string *)&result);
  }
  else {
    pcVar2 = status->Makefile;
    cmStrCat<char_const(&)[14],std::__cxx11::string&,char_const(&)[39]>
              (&result,(char (*) [14])"directory\n  \"",&parentDir,
               (char (*) [39])"\"\ncreation failed (check permissions).");
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&result);
LAB_0039dee7:
    std::__cxx11::string::~string((string *)&result);
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&parentDir);
LAB_0039e201:
  std::__cxx11::string::~string((string *)&path);
LAB_0039e20b:
  std::__cxx11::string::~string((string *)&resultVariable);
  return bVar5;
}

Assistant:

bool HandleLockCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(merr, ", but got:\n  \"", args[i], "\"."));
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR, "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmStrToLong(args[i], &scanned) || scanned < 0) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("TIMEOUT value \"", args[i],
                   "\" is not an unsigned integer."));
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                 "TIMEOUT\nbut got: \"", args[i], "\"."));
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(
    path, status.GetMakefile().GetCurrentSourceDirectory());

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("directory\n  \"", parentDir,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("file\n  \"", path,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    status.GetMakefile().GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccurred();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("error locking file\n  \"", path, "\"\n", result, "."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!resultVariable.empty()) {
    status.GetMakefile().AddDefinition(resultVariable, result);
  }

  return true;
#else
  static_cast<void>(args);
  status.SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}